

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O3

FT_Error cff_parser_init(CFF_Parser parser,FT_UInt code,void *object,FT_Library library,
                        FT_UInt stackSize,FT_UShort num_designs,FT_UShort num_axes)

{
  FT_Memory memory;
  undefined8 in_RAX;
  FT_Byte **P;
  int iVar1;
  int local_34 [2];
  FT_Error error;
  
  local_34[0] = (int)((ulong)in_RAX >> 0x20);
  memory = library->memory;
  parser->top = (FT_Byte **)0x0;
  parser->stackSize = 0;
  parser->object_code = 0;
  parser->object = (void *)0x0;
  parser->num_designs = 0;
  parser->num_axes = 0;
  *(undefined4 *)&parser->field_0x44 = 0;
  parser->cursor = (FT_Byte *)0x0;
  parser->stack = (FT_Byte **)0x0;
  parser->start = (FT_Byte *)0x0;
  parser->limit = (FT_Byte *)0x0;
  parser->object_code = code;
  parser->object = object;
  parser->library = library;
  parser->num_designs = num_designs;
  parser->num_axes = num_axes;
  iVar1 = 0;
  P = (FT_Byte **)ft_mem_realloc(memory,8,0,(ulong)stackSize,(void *)0x0,local_34);
  parser->stack = P;
  if (local_34[0] == 0) {
    parser->stackSize = stackSize;
    parser->top = P;
  }
  else {
    ft_mem_free(memory,P);
    parser->stack = (FT_Byte **)0x0;
    iVar1 = local_34[0];
  }
  return iVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_parser_init( CFF_Parser  parser,
                   FT_UInt     code,
                   void*       object,
                   FT_Library  library,
                   FT_UInt     stackSize,
                   FT_UShort   num_designs,
                   FT_UShort   num_axes )
  {
    FT_Memory  memory = library->memory;    /* for FT_NEW_ARRAY */
    FT_Error   error;                       /* for FT_NEW_ARRAY */


    FT_ZERO( parser );

#if 0
    parser->top         = parser->stack;
#endif
    parser->object_code = code;
    parser->object      = object;
    parser->library     = library;
    parser->num_designs = num_designs;
    parser->num_axes    = num_axes;

    /* allocate the stack buffer */
    if ( FT_NEW_ARRAY( parser->stack, stackSize ) )
    {
      FT_FREE( parser->stack );
      goto Exit;
    }

    parser->stackSize = stackSize;
    parser->top       = parser->stack;    /* empty stack */

  Exit:
    return error;
  }